

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O3

void __thiscall NominalTest_TestIterSubTypes_Test::TestBody(NominalTest_TestIterSubTypes_Test *this)

{
  unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_> type;
  Impl *pIVar1;
  unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_> type_00;
  Impl *pIVar2;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  initializer_list<wasm::HeapType> __l;
  undefined1 auStack_158 [8];
  SubTypes subTypes;
  undefined1 local_100 [8];
  TypeBuilder builder;
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> local_e0;
  undefined4 local_d8;
  undefined1 local_d0 [8];
  undefined1 local_c8 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> _Stack_98;
  undefined4 local_90;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  __node_base local_78;
  AssertHelper local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  __node_gen_type __node_gen;
  undefined1 local_38 [6];
  undefined1 local_32;
  undefined1 local_31;
  
  wasm::TypeBuilder::TypeBuilder((TypeBuilder *)local_100,4);
  auStack_158 = (undefined1  [8])0x0;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  wasm::TypeBuilder::setHeapType((ulong)local_100,(Struct *)0x0);
  if (auStack_158 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_158,
                    (long)subTypes.types.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_158);
  }
  auStack_158 = (undefined1  [8])0x0;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  wasm::TypeBuilder::setHeapType((ulong)local_100,(Struct *)0x1);
  if (auStack_158 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_158,
                    (long)subTypes.types.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_158);
  }
  auStack_158 = (undefined1  [8])0x0;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  wasm::TypeBuilder::setHeapType((ulong)local_100,(Struct *)0x2);
  if (auStack_158 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_158,
                    (long)subTypes.types.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_158);
  }
  auStack_158 = (undefined1  [8])0x0;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  wasm::TypeBuilder::setHeapType((ulong)local_100,(Struct *)0x3);
  if (auStack_158 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_158,
                    (long)subTypes.types.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_158);
  }
  wasm::TypeBuilder::getTempHeapType((ulong)local_100);
  wasm::TypeBuilder::setSubType((ulong)local_100,(HeapType)0x1);
  wasm::TypeBuilder::getTempHeapType((ulong)local_100);
  wasm::TypeBuilder::setSubType((ulong)local_100,(HeapType)0x2);
  wasm::TypeBuilder::getTempHeapType((ulong)local_100);
  wasm::TypeBuilder::setSubType((ulong)local_100,(HeapType)0x3);
  wasm::TypeBuilder::build();
  local_88[0] = (byte)subTypes.types.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage == 0;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((byte)subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
    __x = std::
          get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                    ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      *)auStack_158);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_c8,__x);
    type._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         *(__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
           *)local_c8;
    pIVar1 = (((__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
                *)((long)local_c8 + 8))->
             super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
             )._M_t.
             super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
             .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    type_00._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
          )(((__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
              *)((long)local_c8 + 0x10))->
           super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
           )._M_t.
           super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
           .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    pIVar2 = (((__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
                *)((long)local_c8 + 0x18))->
             super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
             )._M_t.
             super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
             .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    operator_delete((void *)local_c8,
                    (long)built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_c8);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr
      [(byte)subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage]._M_data)
              ((anon_class_1_0_00000001 *)local_c8,
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)auStack_158);
    wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)local_100);
    __l._M_len = 4;
    __l._M_array = (iterator)local_c8;
    local_c8 = (undefined1  [8])
               type._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pIVar1;
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)type_00._M_t.
                  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                  .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pIVar2;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_88,__l,
               (allocator_type *)local_100);
    wasm::SubTypes::SubTypes
              ((SubTypes *)auStack_158,
               (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_88);
    if (local_88 != (undefined1  [8])0x0) {
      operator_delete((void *)local_88,(long)local_78._M_nxt - (long)local_88);
    }
    local_c8 = (undefined1  [8])&_Stack_98;
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x1;
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _Stack_98._M_head_impl = (Impl *)0x0;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((ulong)local_80 & 0xffffffff00000000);
    local_88 = (undefined1  [8])
               type._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    local_48._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
    std::
    _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::pair<wasm::HeapType,unsigned_int>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType,unsigned_int>,true>>>>
              ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_c8);
    __node_gen._M_h._0_4_ = 0;
    local_48._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         type._M_t.
         super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
         .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    std::
    _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::pair<wasm::HeapType,unsigned_int>const*>
              ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_88,&local_48,local_38,0,&local_50,&local_31,&local_32);
    testing::internal::
    CmpHelperEQ<std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>,std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
              ((internal *)local_100,"getSubTypes(A, 0)","TypeDepths({{A, 0}})",
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_c8,
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_88);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_88);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_c8);
    if (local_100[0] == (allocator_type)0x0) {
      testing::Message::Message((Message *)local_c8);
      if ((undefined8 *)
          CONCAT44(builder.impl._M_t.
                   super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._4_4_,
                   builder.impl._M_t.
                   super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_4_) ==
          (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)CONCAT44(builder.impl._M_t.
                                    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                    _M_head_impl._4_4_,
                                    builder.impl._M_t.
                                    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                    _M_head_impl._0_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x469,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
      if (local_c8 != (undefined1  [8])0x0) {
        (**(code **)(*(Impl **)local_c8 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(builder.impl._M_t.
                 super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._4_4_,
                 builder.impl._M_t.
                 super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_4_) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&builder,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(builder.impl._M_t.
                            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl.
                            _4_4_,builder.impl._M_t.
                                  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                  .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                  _M_head_impl._0_4_));
    }
    TestBody::anon_class_8_1_6b5fb797::operator()
              ((TypeDepths *)local_c8,(anon_class_8_1_6b5fb797 *)auStack_158,
               (HeapType)
               type._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,1);
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_4_ = 0;
    local_d8 = 1;
    local_100 = (undefined1  [8])
                type._M_t.
                super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    local_e0._M_head_impl =
         (Impl *)type_00._M_t.
                 super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    std::
    _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::pair<wasm::HeapType,unsigned_int>const*>
              ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_88,local_100,local_d0,0,&local_50,&local_31,&local_32);
    testing::internal::
    CmpHelperEQ<std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>,std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
              ((internal *)&local_48,"getSubTypes(A, 1)","TypeDepths({{A, 0}, {B, 1}, {C, 1}})",
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_c8,
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_88);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_88);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_c8);
    if (local_48._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_c8);
      if ((undefined8 *)CONCAT44(__node_gen._M_h._4_4_,__node_gen._M_h._0_4_) == (undefined8 *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)CONCAT44(__node_gen._M_h._4_4_,__node_gen._M_h._0_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x46a,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
      if (local_c8 != (undefined1  [8])0x0) {
        (**(code **)(*(Impl **)local_c8 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(__node_gen._M_h._4_4_,__node_gen._M_h._0_4_) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&__node_gen,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(__node_gen._M_h._4_4_,__node_gen._M_h._0_4_));
    }
    TestBody::anon_class_8_1_6b5fb797::operator()
              ((TypeDepths *)local_88,(anon_class_8_1_6b5fb797 *)auStack_158,
               (HeapType)
               type._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,2);
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,1);
    local_90 = 2;
    local_c8 = (undefined1  [8])
               type._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pIVar1;
    _Stack_98._M_head_impl = pIVar2;
    std::
    _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::pair<wasm::HeapType,unsigned_int>const*>
              ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_100,local_c8,local_88,0,&local_50,&local_31,&local_32);
    testing::internal::
    CmpHelperEQ<std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>,std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
              ((internal *)&local_48,"getSubTypes(A, 2)",
               "TypeDepths({{A, 0}, {B, 1}, {C, 1}, {D, 2}})",
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_88,
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_100);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_100);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_88);
    if (local_48._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_c8);
      if ((undefined8 *)CONCAT44(__node_gen._M_h._4_4_,__node_gen._M_h._0_4_) == (undefined8 *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)CONCAT44(__node_gen._M_h._4_4_,__node_gen._M_h._0_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x46b,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
      if (local_c8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c8 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(__node_gen._M_h._4_4_,__node_gen._M_h._0_4_) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&__node_gen,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(__node_gen._M_h._4_4_,__node_gen._M_h._0_4_));
    }
    TestBody::anon_class_8_1_6b5fb797::operator()
              ((TypeDepths *)local_88,(anon_class_8_1_6b5fb797 *)auStack_158,
               (HeapType)
               type._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,3);
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,1);
    local_90 = 2;
    local_c8 = (undefined1  [8])
               type._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pIVar1;
    _Stack_98._M_head_impl = pIVar2;
    std::
    _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::pair<wasm::HeapType,unsigned_int>const*>
              ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_100,
               (_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_c8,local_88,0,&local_50,&local_31,&local_32);
    testing::internal::
    CmpHelperEQ<std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>,std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
              ((internal *)&local_48,"getSubTypes(A, 3)",
               "TypeDepths({{A, 0}, {B, 1}, {C, 1}, {D, 2}})",
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_88,
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_100);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_100);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_88);
    if (local_48._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_c8);
      if ((undefined8 *)CONCAT44(__node_gen._M_h._4_4_,__node_gen._M_h._0_4_) == (undefined8 *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)CONCAT44(__node_gen._M_h._4_4_,__node_gen._M_h._0_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x46c,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
      if (local_c8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c8 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(__node_gen._M_h._4_4_,__node_gen._M_h._0_4_) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&__node_gen,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(__node_gen._M_h._4_4_,__node_gen._M_h._0_4_));
    }
    local_c8 = (undefined1  [8])&_Stack_98;
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x1;
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _Stack_98._M_head_impl = (Impl *)0x0;
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((ulong)local_80 & 0xffffffff00000000);
    local_88 = (undefined1  [8])
               type_00._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    local_48._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
    std::
    _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::pair<wasm::HeapType,unsigned_int>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<wasm::HeapType,unsigned_int>,true>>>>
              ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_c8);
    __node_gen._M_h._0_4_ = 0;
    local_48._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         type_00._M_t.
         super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
         .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    std::
    _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::pair<wasm::HeapType,unsigned_int>const*>
              ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_88,&local_48,local_38,0,&local_50,&local_31,&local_32);
    testing::internal::
    CmpHelperEQ<std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>,std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
              ((internal *)local_100,"getSubTypes(C, 0)","TypeDepths({{C, 0}})",
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_c8,
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_88);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_88);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_c8);
    if (local_100[0] == (allocator_type)0x0) {
      testing::Message::Message((Message *)local_c8);
      if ((undefined8 *)
          CONCAT44(builder.impl._M_t.
                   super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._4_4_,
                   builder.impl._M_t.
                   super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_4_) ==
          (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)CONCAT44(builder.impl._M_t.
                                    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                    _M_head_impl._4_4_,
                                    builder.impl._M_t.
                                    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                    _M_head_impl._0_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x46e,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
      if (local_c8 != (undefined1  [8])0x0) {
        (**(code **)(*(Impl **)local_c8 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(builder.impl._M_t.
                 super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._4_4_,
                 builder.impl._M_t.
                 super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_4_) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&builder,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(builder.impl._M_t.
                            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl.
                            _4_4_,builder.impl._M_t.
                                  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                  .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                  _M_head_impl._0_4_));
    }
    TestBody::anon_class_8_1_6b5fb797::operator()
              ((TypeDepths *)local_c8,(anon_class_8_1_6b5fb797 *)auStack_158,
               (HeapType)
               type_00._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,1);
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_4_ = 0;
    local_100 = (undefined1  [8])
                type_00._M_t.
                super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    std::
    _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::pair<wasm::HeapType,unsigned_int>const*>
              ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_88,local_100,&local_e0,0,&local_50,&local_31,&local_32);
    testing::internal::
    CmpHelperEQ<std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>,std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
              ((internal *)&local_48,"getSubTypes(C, 1)","TypeDepths({{C, 0}, {D, 1}})",
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_c8,
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_88);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_88);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_c8);
    if (local_48._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_c8);
      if ((undefined8 *)CONCAT44(__node_gen._M_h._4_4_,__node_gen._M_h._0_4_) == (undefined8 *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)CONCAT44(__node_gen._M_h._4_4_,__node_gen._M_h._0_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x46f,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
      if (local_c8 != (undefined1  [8])0x0) {
        (**(code **)(*(Impl **)local_c8 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(__node_gen._M_h._4_4_,__node_gen._M_h._0_4_) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&__node_gen,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(__node_gen._M_h._4_4_,__node_gen._M_h._0_4_));
    }
    TestBody::anon_class_8_1_6b5fb797::operator()
              ((TypeDepths *)local_c8,(anon_class_8_1_6b5fb797 *)auStack_158,
               (HeapType)
               type_00._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,2);
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_4_ = 0;
    local_100 = (undefined1  [8])
                type_00._M_t.
                super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    std::
    _Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::pair<wasm::HeapType,unsigned_int>const*>
              ((_Hashtable<std::pair<wasm::HeapType,unsigned_int>,std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Identity,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_88,local_100,&local_e0,0,&local_50,&local_31,&local_32);
    testing::internal::
    CmpHelperEQ<std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>,std::unordered_set<std::pair<wasm::HeapType,unsigned_int>,std::hash<std::pair<wasm::HeapType,unsigned_int>>,std::equal_to<std::pair<wasm::HeapType,unsigned_int>>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
              ((internal *)&local_48,"getSubTypes(C, 2)","TypeDepths({{C, 0}, {D, 1}})",
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_c8,
               (unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)local_88);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_88);
    std::
    _Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::pair<wasm::HeapType,_unsigned_int>,_std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_c8);
    if (local_48._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_c8);
      if ((undefined8 *)CONCAT44(__node_gen._M_h._4_4_,__node_gen._M_h._0_4_) == (undefined8 *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)CONCAT44(__node_gen._M_h._4_4_,__node_gen._M_h._0_4_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x470,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
      if (local_c8 != (undefined1  [8])0x0) {
        (**(code **)(*(Impl **)local_c8 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(__node_gen._M_h._4_4_,__node_gen._M_h._0_4_) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&__node_gen,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(__node_gen._M_h._4_4_,__node_gen._M_h._0_4_));
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&subTypes.types.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    if (auStack_158 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_158,
                      (long)subTypes.types.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_158);
    }
  }
  else {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)local_88,(AssertionResult *)"result","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x454,(char *)local_c8);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_c8 !=
        (undefined1  [8])
        &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
         super__Vector_impl_data._M_finish) {
      operator_delete((void *)local_c8,
                      (ulong)((long)&(built.
                                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                      ._M_impl.super__Vector_impl_data._M_finish)->id + 1));
    }
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr
      [(byte)subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage]._M_data)
              ((anon_class_1_0_00000001 *)local_c8,
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)auStack_158);
    wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)local_100);
  }
  return;
}

Assistant:

TEST_F(NominalTest, TestIterSubTypes) {
  /*
        A
       / \
      B   C
           \
            D
  */
  HeapType A, B, C, D;
  {
    TypeBuilder builder(4);
    builder[0] = Struct();
    builder[1] = Struct();
    builder[2] = Struct();
    builder[3] = Struct();
    builder.setSubType(1, builder.getTempHeapType(0));
    builder.setSubType(2, builder.getTempHeapType(0));
    builder.setSubType(3, builder.getTempHeapType(2));
    auto result = builder.build();
    ASSERT_TRUE(result);
    auto built = *result;
    A = built[0];
    B = built[1];
    C = built[2];
    D = built[3];
  }

  SubTypes subTypes({A, B, C, D});

  // Helper for comparing sets of types + their corresponding depth.
  using TypeDepths = std::unordered_set<std::pair<HeapType, Index>>;

  auto getSubTypes = [&](HeapType type, Index depth) {
    TypeDepths ret;
    subTypes.iterSubTypes(type, depth, [&](HeapType subType, Index depth) {
      ret.insert({subType, depth});
    });
    return ret;
  };

  EXPECT_EQ(getSubTypes(A, 0), TypeDepths({{A, 0}}));
  EXPECT_EQ(getSubTypes(A, 1), TypeDepths({{A, 0}, {B, 1}, {C, 1}}));
  EXPECT_EQ(getSubTypes(A, 2), TypeDepths({{A, 0}, {B, 1}, {C, 1}, {D, 2}}));
  EXPECT_EQ(getSubTypes(A, 3), TypeDepths({{A, 0}, {B, 1}, {C, 1}, {D, 2}}));

  EXPECT_EQ(getSubTypes(C, 0), TypeDepths({{C, 0}}));
  EXPECT_EQ(getSubTypes(C, 1), TypeDepths({{C, 0}, {D, 1}}));
  EXPECT_EQ(getSubTypes(C, 2), TypeDepths({{C, 0}, {D, 1}}));
}